

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ForVariableDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForVariableDeclarationSyntax,slang::parsing::Token&,slang::syntax::DataTypeSyntax*&,slang::syntax::DeclaratorSyntax&>
          (BumpAllocator *this,Token *args,DataTypeSyntax **args_1,DeclaratorSyntax *args_2)

{
  Token varKeyword;
  ForVariableDeclarationSyntax *pFVar1;
  ForVariableDeclarationSyntax *in_RCX;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  
  pFVar1 = (ForVariableDeclarationSyntax *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8)
  ;
  varKeyword.info = in_RSI;
  varKeyword._0_8_ = in_RDX;
  slang::syntax::ForVariableDeclarationSyntax::ForVariableDeclarationSyntax
            (in_RCX,varKeyword,(DataTypeSyntax *)in_RSI->location,
             (DeclaratorSyntax *)in_RSI->rawTextPtr);
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }